

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_set_next_stream_id(nghttp2_session *session,int32_t next_stream_id)

{
  int iVar1;
  
  iVar1 = -0x1f5;
  if ((0 < next_stream_id) && (session->next_stream_id <= (uint)next_stream_id)) {
    if (session->server == '\0') {
      if ((next_stream_id & 1U) == 0) {
        return -0x1f5;
      }
    }
    else if ((next_stream_id & 1U) != 0) {
      return -0x1f5;
    }
    session->next_stream_id = next_stream_id;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nghttp2_session_set_next_stream_id(nghttp2_session *session,
                                       int32_t next_stream_id) {
  if (next_stream_id <= 0 ||
      session->next_stream_id > (uint32_t)next_stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (session->server) {
    if (next_stream_id % 2) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }
  } else if (next_stream_id % 2 == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  session->next_stream_id = (uint32_t)next_stream_id;
  return 0;
}